

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeep_fruinfo.c
# Opt level: O1

void IpmiFruBuildProductInfoArea(EeePSystemInfo_t *info)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  int iVar4;
  EeePSystemInfo_t *value;
  uint8_t uVar5;
  EeePSystemInfo_t *pEVar6;
  uint8_t *puVar7;
  
  product_info_area.area.format_version = '\x01';
  product_info_area.area.language_code = '\x19';
  value = info + 1;
  uVar5 = info->Manufacturer;
  pEVar6 = value;
  if (uVar5 == '\0') {
    pEVar6 = (EeePSystemInfo_t *)0x0;
  }
  else {
    while (uVar5 = uVar5 + 0xff, uVar5 != '\0') {
      sVar3 = strlen((char *)pEVar6);
      pEVar6 = (EeePSystemInfo_t *)((pEVar6->SDBHdr).CDBHdr.DBlockLength + sVar3);
    }
  }
  puVar7 = product_info_area.pad;
  if (pEVar6 == (EeePSystemInfo_t *)0x0) {
    product_info_area.area.variable_part[0] = 0xc0;
  }
  else {
    sVar3 = strlen((char *)pEVar6);
    iVar1 = (int)sVar3;
    iVar4 = 0x3f;
    if (iVar1 < 0x3f) {
      iVar4 = iVar1;
    }
    iVar2 = 2;
    if (iVar1 != 1) {
      iVar2 = iVar4;
    }
    product_info_area.area.variable_part[0] = (char)iVar2 + 0xc0;
    if (iVar2 != 0) {
      memcpy(product_info_area.pad,pEVar6,(long)iVar2);
      puVar7 = product_info_area.pad + iVar2;
    }
  }
  uVar5 = info->ProductName;
  pEVar6 = value;
  if (uVar5 == '\0') {
    pEVar6 = (EeePSystemInfo_t *)0x0;
  }
  else {
    while (uVar5 = uVar5 + 0xff, uVar5 != '\0') {
      sVar3 = strlen((char *)pEVar6);
      pEVar6 = (EeePSystemInfo_t *)((pEVar6->SDBHdr).CDBHdr.DBlockLength + sVar3);
    }
  }
  if (pEVar6 == (EeePSystemInfo_t *)0x0) {
    *puVar7 = 0xc0;
    puVar7 = puVar7 + 1;
  }
  else {
    sVar3 = strlen((char *)pEVar6);
    iVar1 = (int)sVar3;
    iVar4 = 0x3f;
    if (iVar1 < 0x3f) {
      iVar4 = iVar1;
    }
    iVar2 = 2;
    if (iVar1 != 1) {
      iVar2 = iVar4;
    }
    *puVar7 = (char)iVar2 + 0xc0;
    puVar7 = puVar7 + 1;
    if (iVar2 != 0) {
      memcpy(puVar7,pEVar6,(long)iVar2);
      puVar7 = puVar7 + iVar2;
    }
  }
  *puVar7 = 0xc0;
  uVar5 = info->Version;
  pEVar6 = value;
  if (uVar5 == '\0') {
    pEVar6 = (EeePSystemInfo_t *)0x0;
  }
  else {
    while (uVar5 = uVar5 + 0xff, uVar5 != '\0') {
      sVar3 = strlen((char *)pEVar6);
      pEVar6 = (EeePSystemInfo_t *)((pEVar6->SDBHdr).CDBHdr.DBlockLength + sVar3);
    }
  }
  if (pEVar6 == (EeePSystemInfo_t *)0x0) {
    puVar7[1] = 0xc0;
    puVar7 = puVar7 + 2;
  }
  else {
    sVar3 = strlen((char *)pEVar6);
    iVar1 = (int)sVar3;
    iVar4 = 0x3f;
    if (iVar1 < 0x3f) {
      iVar4 = iVar1;
    }
    iVar2 = 2;
    if (iVar1 != 1) {
      iVar2 = iVar4;
    }
    puVar7[1] = (char)iVar2 + 0xc0;
    puVar7 = puVar7 + 2;
    if (iVar2 != 0) {
      memcpy(puVar7,pEVar6,(long)iVar2);
      puVar7 = puVar7 + iVar2;
    }
  }
  uVar5 = info->SerialNumber;
  pEVar6 = value;
  if (uVar5 == '\0') {
    pEVar6 = (EeePSystemInfo_t *)0x0;
  }
  else {
    while (uVar5 = uVar5 + 0xff, uVar5 != '\0') {
      sVar3 = strlen((char *)pEVar6);
      pEVar6 = (EeePSystemInfo_t *)((pEVar6->SDBHdr).CDBHdr.DBlockLength + sVar3);
    }
  }
  if (pEVar6 == (EeePSystemInfo_t *)0x0) {
    *puVar7 = 0xc0;
    puVar7 = puVar7 + 1;
  }
  else {
    sVar3 = strlen((char *)pEVar6);
    iVar1 = (int)sVar3;
    iVar4 = 0x3f;
    if (iVar1 < 0x3f) {
      iVar4 = iVar1;
    }
    iVar2 = 2;
    if (iVar1 != 1) {
      iVar2 = iVar4;
    }
    *puVar7 = (char)iVar2 + 0xc0;
    puVar7 = puVar7 + 1;
    if (iVar2 != 0) {
      memcpy(puVar7,pEVar6,(long)iVar2);
      puVar7 = puVar7 + iVar2;
    }
  }
  uVar5 = info->SKU_Number;
  pEVar6 = value;
  if (uVar5 == '\0') {
    pEVar6 = (EeePSystemInfo_t *)0x0;
  }
  else {
    while (uVar5 = uVar5 + 0xff, uVar5 != '\0') {
      sVar3 = strlen((char *)pEVar6);
      pEVar6 = (EeePSystemInfo_t *)((pEVar6->SDBHdr).CDBHdr.DBlockLength + sVar3);
    }
  }
  if (pEVar6 == (EeePSystemInfo_t *)0x0) {
    *puVar7 = 0xc0;
    puVar7 = puVar7 + 1;
  }
  else {
    sVar3 = strlen((char *)pEVar6);
    iVar1 = (int)sVar3;
    iVar4 = 0x3f;
    if (iVar1 < 0x3f) {
      iVar4 = iVar1;
    }
    iVar2 = 2;
    if (iVar1 != 1) {
      iVar2 = iVar4;
    }
    *puVar7 = (char)iVar2 + 0xc0;
    puVar7 = puVar7 + 1;
    if (iVar2 != 0) {
      memcpy(puVar7,pEVar6,(long)iVar2);
      puVar7 = puVar7 + iVar2;
    }
  }
  *puVar7 = 0xc0;
  uVar5 = info->Family;
  if (uVar5 == '\0') {
    value = (EeePSystemInfo_t *)0x0;
  }
  else {
    while (uVar5 = uVar5 + 0xff, uVar5 != '\0') {
      sVar3 = strlen((char *)value);
      value = (EeePSystemInfo_t *)((value->SDBHdr).CDBHdr.DBlockLength + sVar3);
    }
  }
  puVar7 = puVar7 + 1;
  if (value != (EeePSystemInfo_t *)0x0) {
    puVar7 = IpmiFruAddCustomString(puVar7,"FAMILY",(char *)value);
  }
  product_info_area_size = IpmiFruFinalizeArea((uint8_t *)&product_info_area,(int)puVar7 - 0x106174)
  ;
  return;
}

Assistant:

void IpmiFruBuildProductInfoArea(EeePSystemInfo_t *info)
{
    product_info_area.area.format_version = IPMI_FRUINFO_FORMAT_VERSION;
    product_info_area.area.language_code = IPMI_FRUINFO_LANGUAGE_CODE_ENGLISH;
    uint8_t *varp = product_info_area.area.variable_part;

    void *strstart = info + 1;
    const char *str;
    //  Manufacturer
    if (str = GetSmbiosString(info->Manufacturer, strstart)) {
        varp = IpmiFruAddString(varp, str);
    } else {
        *varp++ = 0xC0;
    }
    //  Product name
    if (str = GetSmbiosString(info->ProductName, strstart)) {
        varp = IpmiFruAddString(varp, str);
    } else {
        *varp++ = 0xC0;
    }
    //  Model/Part number - not specified
    *varp++ = 0xC0;
    //  Version
    if (str = GetSmbiosString(info->Version, strstart)) {
        varp = IpmiFruAddString(varp, str);
    } else {
        *varp++ = 0xC0;
    }
    //  Serial number
    if (str = GetSmbiosString(info->SerialNumber, strstart)) {
        varp = IpmiFruAddString(varp, str);
    } else {
        *varp++ = 0xC0;
    }
    //  Asset tag - use SKU number
    if (str = GetSmbiosString(info->SKU_Number, strstart)) {
        varp = IpmiFruAddString(varp, str);
    } else {
        *varp++ = 0xC0;
    }
    //  FRU File ID - not specified
    *varp++ = 0xC0;
    //  Family as custom string
    if (str = GetSmbiosString(info->Family, strstart)) {
        varp = IpmiFruAddCustomString(varp, "FAMILY", str);
    }
    uint8_t *product_area_ptr = (uint8_t *)&product_info_area;
    product_info_area_size = IpmiFruFinalizeArea(product_area_ptr, varp-product_area_ptr);
}